

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

faup_options_t * faup_options_new(void)

{
  faup_options_t *pfVar1;
  TLDNode *pTVar2;
  
  pfVar1 = (faup_options_t *)malloc(0x58);
  if (pfVar1 != (faup_options_t *)0x0) {
    pfVar1->print_header = 0;
    pfVar1->print_line = 0;
    pfVar1->sep_char = ',';
    pfVar1->input_source = FAUP_INPUT_SOURCE_ARGUMENT;
    pfVar1->output = FAUP_OUTPUT_NONE;
    pfVar1->current_line = 1;
    pfVar1->exec_modules = FAUP_MODULES_NOEXEC;
    pfVar1->modules_argv = (char **)0x0;
    pfVar1->modules_argc = 0;
    pfVar1->number_of_chars_to_remove = 0;
    pfVar1->tld_greater_extraction = 1;
    pTVar2 = faup_tld_tree_new();
    pfVar1->tld_tree = pTVar2;
    pfVar1->fields =
         FAUP_URL_FIELD_URL_TYPE|FAUP_URL_FIELD_FRAGMENT|FAUP_URL_FIELD_QUERY_STRING|
         FAUP_URL_FIELD_RESOURCE_PATH|FAUP_URL_FIELD_PORT|FAUP_URL_FIELD_TLD|FAUP_URL_FIELD_HOST|
         FAUP_URL_FIELD_DOMAIN_WITHOUT_TLD|FAUP_URL_FIELD_DOMAIN|FAUP_URL_FIELD_SUBDOMAIN|
         FAUP_URL_FIELD_CREDENTIAL|FAUP_URL_FIELD_SCHEME;
    pfVar1->snapshot_name = (char *)0x0;
    pfVar1->quiet = 0;
    pfVar1->empty_lines_processed = 0;
  }
  return pfVar1;
}

Assistant:

faup_options_t *faup_options_new(void)
{
	faup_options_t *opts;

	opts = malloc(sizeof(faup_options_t));
	if (!opts) {
		return NULL;
	}

	faup_options_defaults(opts);

	return opts;
}